

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O0

bool __thiscall
ON_DimStyle::Internal_SetIdMember
          (ON_DimStyle *this,field field_id,ON_UUID value,ON_UUID *class_member)

{
  bool bVar1;
  bool bValueChanged;
  ON_UUID *class_member_local;
  field field_id_local;
  ON_DimStyle *this_local;
  ON_UUID value_local;
  
  value_local._0_8_ = value.Data4;
  this_local = value._0_8_;
  bVar1 = ::operator!=((ON_UUID_struct *)&this_local,class_member);
  if (bVar1) {
    *(ON_DimStyle **)class_member = this_local;
    *(undefined8 *)class_member->Data4 = value_local._0_8_;
    Internal_ContentChange(this);
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(this,field_id);
  return bVar1;
}

Assistant:

bool ON_DimStyle::Internal_SetIdMember(
  ON_DimStyle::field field_id,
  ON_UUID value,
  ON_UUID& class_member
)
{
  bool bValueChanged = false;
  if (value != class_member)
  {
    class_member = value;
    Internal_ContentChange();
    bValueChanged = true;
  }
  Internal_SetOverrideDimStyleCandidateFieldOverride(field_id);
  return bValueChanged;
}